

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoConvert<double,unsigned_int>(Thread *this,Ptr *out_trap)

{
  Value value;
  Value VVar1;
  
  VVar1 = Pop(this);
  value.field_0._8_8_ = 0;
  value.field_0.f64_ = (f64)(double)VVar1.field_0.i32_;
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}